

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O3

bool __thiscall irr::video::COpenGLDriver::genericDriverInit(COpenGLDriver *this)

{
  stringc *this_00;
  pointer *ppSVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  IContextManager *pIVar3;
  IAttributes *pIVar4;
  iterator __position;
  double dVar5;
  int iVar6;
  uchar *c;
  long lVar7;
  char *c_00;
  COpenGLCacheHandler *this_01;
  code *pcVar8;
  uint uVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  char buf [32];
  string<char> local_48;
  
  pIVar3 = this->ContextManager;
  if (pIVar3 != (IContextManager *)0x0) {
    *(int *)(&pIVar3->field_0x10 + (long)pIVar3->_vptr_IContextManager[-3]) =
         *(int *)(&pIVar3->field_0x10 + (long)pIVar3->_vptr_IContextManager[-3]) + 1;
  }
  this_00 = &this->Name;
  core::string<char>::operator=(this_00,"OpenGL ");
  c = (uchar *)glGetString(0x1f02);
  paVar2 = &local_48.str.field_2;
  local_48.str._M_string_length = 0;
  local_48.str.field_2._M_allocated_capacity._0_4_ =
       local_48.str.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_48.str._M_dataplus._M_p = (pointer)paVar2;
  core::string<char>::operator=(&local_48,c);
  ::std::__cxx11::string::_M_append((char *)this_00,(ulong)local_48.str._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.str._M_dataplus._M_p != paVar2) {
    operator_delete(local_48.str._M_dataplus._M_p,
                    CONCAT44(local_48.str.field_2._M_allocated_capacity._4_4_,
                             local_48.str.field_2._M_allocated_capacity._0_4_) + 1);
  }
  iVar6 = ::std::__cxx11::string::find((char)this_00,0x20);
  if (iVar6 != -1) {
    core::string<char>::subString(&local_48,this_00,0,iVar6,false);
    if (this_00 != &local_48) {
      ::std::__cxx11::string::_M_assign((string *)this_00);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.str._M_dataplus._M_p != paVar2) {
      operator_delete(local_48.str._M_dataplus._M_p,
                      CONCAT44(local_48.str.field_2._M_allocated_capacity._4_4_,
                               local_48.str.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  CNullDriver::printVersion(&this->super_CNullDriver);
  lVar7 = glGetString(0x1f01);
  c_00 = (char *)glGetString(0x1f00);
  if (c_00 != (char *)0x0 && lVar7 != 0) {
    os::Printer::log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    core::string<char>::operator=(&this->VendorName,c_00);
  }
  COpenGLExtensionHandler::initExtensions
            ((COpenGLExtensionHandler *)&(this->super_CNullDriver).field_0x498,this->ContextManager,
             (this->Params).Stencilbuffer);
  if (this->CacheHandler != (COpenGLCacheHandler *)0x0) {
    (*(this->CacheHandler->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      )._vptr_COpenGLCoreCacheHandler[1])();
  }
  this_01 = (COpenGLCacheHandler *)operator_new(0xd8);
  COpenGLCacheHandler::COpenGLCacheHandler(this_01,this);
  this->CacheHandler = this_01;
  iVar6 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[2])(this,0x12);
  if ((char)iVar6 == '\0') {
    dVar5 = os::Printer::log((Printer *)"GLSL not available.",
                             (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    uVar10 = SUB84(dVar5,0);
  }
  else {
    uVar9 = (*(ushort *)&this->field_0x4d2 >> 2) / 0x19;
    snprintf((char *)&local_48,0x20,"%u.%u",(ulong)uVar9,
             (ulong)(uVar9 * -100 + (uint)*(ushort *)&this->field_0x4d2));
    dVar5 = os::Printer::log((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
    uVar10 = SUB84(dVar5,0);
  }
  pIVar4 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar4->_vptr_IAttributes[8])(uVar10,pIVar4,"MaxTextures",(ulong)(byte)this->field_0x6c3);
  pIVar4 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar4->_vptr_IAttributes[8])(pIVar4,"MaxSupportedTextures",(ulong)(byte)this->field_0x6c3);
  pIVar4 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar4->_vptr_IAttributes[8])
            (pIVar4,"MaxLights",(ulong)(byte)(this->super_CNullDriver).field_0x49a);
  pIVar4 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar4->_vptr_IAttributes[8])
            (pIVar4,"MaxAnisotropy",(ulong)(byte)(this->super_CNullDriver).field_0x49b);
  pIVar4 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar4->_vptr_IAttributes[8])
            (pIVar4,"MaxUserClipPlanes",(ulong)(byte)(this->super_CNullDriver).field_0x49c);
  pIVar4 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar4->_vptr_IAttributes[8])
            (pIVar4,"MaxAuxBuffers",(ulong)(byte)(this->super_CNullDriver).field_0x49d);
  pIVar4 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar4->_vptr_IAttributes[8])(pIVar4,"MaxMultipleRenderTargets",(ulong)(byte)this->field_0x6c2);
  pIVar4 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar4->_vptr_IAttributes[8])
            (pIVar4,"MaxIndices",(ulong)*(uint *)&(this->super_CNullDriver).field_0x4a0);
  pIVar4 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar4->_vptr_IAttributes[8])
            (pIVar4,"MaxTextureSize",(ulong)*(uint *)&(this->super_CNullDriver).field_0x4a4);
  pIVar4 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar4->_vptr_IAttributes[8])
            (pIVar4,"MaxGeometryVerticesOut",(ulong)*(uint *)&this->field_0x4a8);
  pIVar4 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar4->_vptr_IAttributes[0xd])(*(undefined4 *)&this->field_0x4ac,pIVar4,"MaxTextureLODBias");
  pIVar4 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar4->_vptr_IAttributes[8])(pIVar4,"Version",(ulong)*(ushort *)&this->field_0x4d0);
  pIVar4 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar4->_vptr_IAttributes[8])
            (pIVar4,"ShaderLanguageVersion",(ulong)*(ushort *)&this->field_0x4d2);
  pIVar4 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar4->_vptr_IAttributes[8])(pIVar4,"AntiAlias",(ulong)this->AntiAlias);
  glPixelStorei(0xd05,1);
  core::array<irr::video::COpenGLDriver::SUserClipPlane>::reallocate
            (&this->UserClipPlanes,(uint)(byte)(this->super_CNullDriver).field_0x49c,true);
  if ((this->super_CNullDriver).field_0x49c != '\0') {
    uVar9 = 0;
    do {
      local_48.str._M_dataplus._M_p = (pointer)0x3f80000000000000;
      local_48.str._M_string_length = 0x8000000000000000;
      local_48.str.field_2._M_allocated_capacity._0_4_ =
           local_48.str.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      __position._M_current =
           (this->UserClipPlanes).m_data.
           super__Vector_base<irr::video::COpenGLDriver::SUserClipPlane,_std::allocator<irr::video::COpenGLDriver::SUserClipPlane>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->UserClipPlanes).m_data.
          super__Vector_base<irr::video::COpenGLDriver::SUserClipPlane,_std::allocator<irr::video::COpenGLDriver::SUserClipPlane>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<irr::video::COpenGLDriver::SUserClipPlane,_std::allocator<irr::video::COpenGLDriver::SUserClipPlane>_>
        ::_M_realloc_insert<irr::video::COpenGLDriver::SUserClipPlane>
                  (&(this->UserClipPlanes).m_data,__position,(SUserClipPlane *)&local_48);
      }
      else {
        *(undefined4 *)&(__position._M_current)->Enabled =
             local_48.str.field_2._M_allocated_capacity._0_4_;
        ((__position._M_current)->Plane).Normal.X = 0.0;
        ((__position._M_current)->Plane).Normal.Y = 1.0;
        *(undefined8 *)&((__position._M_current)->Plane).Normal.Z = 0x8000000000000000;
        ppSVar1 = &(this->UserClipPlanes).m_data.
                   super__Vector_base<irr::video::COpenGLDriver::SUserClipPlane,_std::allocator<irr::video::COpenGLDriver::SUserClipPlane>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      (this->UserClipPlanes).is_sorted = false;
      uVar9 = uVar9 + 1;
    } while (uVar9 < (byte)(this->super_CNullDriver).field_0x49c);
  }
  uVar9 = 0;
  do {
    (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[6])
              (this,(ulong)uVar9,&core::IdentityMatrix);
    uVar9 = uVar9 + 1;
  } while (uVar9 != 7);
  local_48.str._M_dataplus._M_p = (pointer)0x0;
  local_48.str._M_string_length = 0;
  (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x61])(this);
  if (this->field_0x5d7 == '\x01') {
    glLightModeli(0x81f8,0x81fa);
  }
  glLightModeli(0xb51,1);
  glClearDepth(0);
  glHint(0xc50,0x1102);
  glFrontFace(0x900);
  pcVar8 = *(code **)&this->field_0xa18;
  if ((this->field_0x540 & pcVar8 != (code *)0x0) == 0) {
    pcVar8 = *(code **)&this->field_0xa20;
    if ((pcVar8 != (code *)0x0 & this->field_0x5d3) != 1) goto LAB_001df3be;
  }
  (*pcVar8)(0x8e4d);
LAB_001df3be:
  this->Quad2DVertices[0].Pos.X = -1.0;
  this->Quad2DVertices[0].Pos.Y = 1.0;
  *(undefined8 *)&this->Quad2DVertices[0].Pos.Z = 0;
  this->Quad2DVertices[0].Normal.Y = 0.0;
  this->Quad2DVertices[0].Normal.Z = 0.0;
  this->Quad2DVertices[0].Color = 0xffffffff;
  this->Quad2DVertices[0].TCoords.X = 0.0;
  this->Quad2DVertices[0].TCoords.Y = 1.0;
  this->Quad2DVertices[1].Pos.X = 1.0;
  this->Quad2DVertices[1].Pos.Y = 1.0;
  *(undefined8 *)&this->Quad2DVertices[1].Pos.Z = 0;
  this->Quad2DVertices[1].Normal.Y = 0.0;
  this->Quad2DVertices[1].Normal.Z = 0.0;
  this->Quad2DVertices[1].Color = 0xffffffff;
  this->Quad2DVertices[1].TCoords.X = 1.0;
  this->Quad2DVertices[1].TCoords.Y = 1.0;
  this->Quad2DVertices[2].Pos.X = 1.0;
  this->Quad2DVertices[2].Pos.Y = -1.0;
  *(undefined8 *)&this->Quad2DVertices[2].Pos.Z = 0;
  this->Quad2DVertices[2].Normal.Y = 0.0;
  this->Quad2DVertices[2].Normal.Z = 0.0;
  this->Quad2DVertices[2].Color = 0xffffffff;
  this->Quad2DVertices[2].TCoords.X = 1.0;
  this->Quad2DVertices[2].TCoords.Y = 0.0;
  this->Quad2DVertices[3].Pos.X = -1.0;
  this->Quad2DVertices[3].Pos.Y = -1.0;
  *(undefined8 *)&this->Quad2DVertices[3].Pos.Z = 0;
  this->Quad2DVertices[3].Normal.Y = 0.0;
  this->Quad2DVertices[3].Normal.Z = 0.0;
  this->Quad2DVertices[3].Color = 0xffffffff;
  this->Quad2DVertices[3].TCoords.X = 0.0;
  this->Quad2DVertices[3].TCoords.Y = 0.0;
  createMaterialRenderers(this);
  setRenderStates3DMode(this);
  (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x38])
            ((this->super_CNullDriver).FogStart,(this->super_CNullDriver).FogEnd,
             (this->super_CNullDriver).FogDensity,this,
             (ulong)(this->super_CNullDriver).FogColor.color,
             (ulong)(this->super_CNullDriver).FogType,(ulong)(this->super_CNullDriver).PixelFog,
             (ulong)(this->super_CNullDriver).RangeFog);
  (this->TextureFlipMatrix).M[0] = 1.0;
  (this->TextureFlipMatrix).M[1] = -0.0;
  (this->TextureFlipMatrix).M[2] = 0.0;
  (this->TextureFlipMatrix).M[3] = 0.0;
  (this->TextureFlipMatrix).M[4] = -0.0;
  (this->TextureFlipMatrix).M[5] = -1.0;
  (this->TextureFlipMatrix).M[6] = 0.0;
  (this->TextureFlipMatrix).M[7] = 0.0;
  (this->TextureFlipMatrix).M[8] = 0.0;
  (this->TextureFlipMatrix).M[9] = 1.0;
  (this->TextureFlipMatrix).M[10] = 1.0;
  (this->TextureFlipMatrix).M[0xb] = 0.0;
  (this->TextureFlipMatrix).M[0xc] = 0.0;
  (this->TextureFlipMatrix).M[0xd] = 0.0;
  (this->TextureFlipMatrix).M[0xe] = 0.0;
  (this->TextureFlipMatrix).M[0xf] = 1.0;
  this->ResetRenderStates = true;
  return true;
}

Assistant:

bool COpenGLDriver::genericDriverInit()
{
	if (ContextManager)
		ContextManager->grab();

	Name = "OpenGL ";
	Name.append(glGetString(GL_VERSION));
	s32 pos = Name.findNext(' ', 7);
	if (pos != -1)
		Name = Name.subString(0, pos);
	printVersion();

	// print renderer information
	const GLubyte *renderer = glGetString(GL_RENDERER);
	const GLubyte *vendor = glGetString(GL_VENDOR);
	if (renderer && vendor) {
		os::Printer::log(reinterpret_cast<const c8 *>(renderer), reinterpret_cast<const c8 *>(vendor), ELL_INFORMATION);
		VendorName = reinterpret_cast<const c8 *>(vendor);
	}

	u32 i;

	// load extensions
	initExtensions(ContextManager, Params.Stencilbuffer);

	// reset cache handler
	delete CacheHandler;
	CacheHandler = new COpenGLCacheHandler(this);

	if (queryFeature(EVDF_ARB_GLSL)) {
		char buf[32];
		const u32 maj = ShaderLanguageVersion / 100;
		snprintf_irr(buf, 32, "%u.%u", maj, ShaderLanguageVersion - maj * 100);
		os::Printer::log("GLSL version", buf, ELL_INFORMATION);
	} else
		os::Printer::log("GLSL not available.", ELL_INFORMATION);
	DriverAttributes->setAttribute("MaxTextures", (s32)Feature.MaxTextureUnits);
	DriverAttributes->setAttribute("MaxSupportedTextures", (s32)Feature.MaxTextureUnits);
	DriverAttributes->setAttribute("MaxLights", MaxLights);
	DriverAttributes->setAttribute("MaxAnisotropy", MaxAnisotropy);
	DriverAttributes->setAttribute("MaxUserClipPlanes", MaxUserClipPlanes);
	DriverAttributes->setAttribute("MaxAuxBuffers", MaxAuxBuffers);
	DriverAttributes->setAttribute("MaxMultipleRenderTargets", (s32)Feature.MultipleRenderTarget);
	DriverAttributes->setAttribute("MaxIndices", (s32)MaxIndices);
	DriverAttributes->setAttribute("MaxTextureSize", (s32)MaxTextureSize);
	DriverAttributes->setAttribute("MaxGeometryVerticesOut", (s32)MaxGeometryVerticesOut);
	DriverAttributes->setAttribute("MaxTextureLODBias", MaxTextureLODBias);
	DriverAttributes->setAttribute("Version", Version);
	DriverAttributes->setAttribute("ShaderLanguageVersion", ShaderLanguageVersion);
	DriverAttributes->setAttribute("AntiAlias", AntiAlias);

	glPixelStorei(GL_PACK_ALIGNMENT, 1);

	UserClipPlanes.reallocate(MaxUserClipPlanes);
	for (i = 0; i < MaxUserClipPlanes; ++i)
		UserClipPlanes.push_back(SUserClipPlane());

	for (i = 0; i < ETS_COUNT; ++i)
		setTransform(static_cast<E_TRANSFORMATION_STATE>(i), core::IdentityMatrix);

	setAmbientLight(SColorf(0.0f, 0.0f, 0.0f, 0.0f));
#ifdef GL_EXT_separate_specular_color
	if (FeatureAvailable[IRR_EXT_separate_specular_color])
		glLightModeli(GL_LIGHT_MODEL_COLOR_CONTROL, GL_SEPARATE_SPECULAR_COLOR);
#endif
	glLightModeli(GL_LIGHT_MODEL_LOCAL_VIEWER, 1);

	// This is a fast replacement for NORMALIZE_NORMALS
	//	if ((Version>101) || FeatureAvailable[IRR_EXT_rescale_normal])
	//		glEnable(GL_RESCALE_NORMAL_EXT);

	glClearDepth(1.0);
	glHint(GL_PERSPECTIVE_CORRECTION_HINT, GL_NICEST);
	glFrontFace(GL_CW);
	// adjust flat coloring scheme to DirectX version
#if defined(GL_ARB_provoking_vertex) || defined(GL_EXT_provoking_vertex)
	extGlProvokingVertex(GL_FIRST_VERTEX_CONVENTION_EXT);
#endif

	// Create built-in 2D quad for 2D rendering (both quads and lines).
	Quad2DVertices[0] = S3DVertex(core::vector3df(-1.0f, 1.0f, 0.0f), core::vector3df(0.0f, 0.0f, 0.0f), SColor(255, 255, 255, 255), core::vector2df(0.0f, 1.0f));
	Quad2DVertices[1] = S3DVertex(core::vector3df(1.0f, 1.0f, 0.0f), core::vector3df(0.0f, 0.0f, 0.0f), SColor(255, 255, 255, 255), core::vector2df(1.0f, 1.0f));
	Quad2DVertices[2] = S3DVertex(core::vector3df(1.0f, -1.0f, 0.0f), core::vector3df(0.0f, 0.0f, 0.0f), SColor(255, 255, 255, 255), core::vector2df(1.0f, 0.0f));
	Quad2DVertices[3] = S3DVertex(core::vector3df(-1.0f, -1.0f, 0.0f), core::vector3df(0.0f, 0.0f, 0.0f), SColor(255, 255, 255, 255), core::vector2df(0.0f, 0.0f));

	// create material renderers
	createMaterialRenderers();

	// set the renderstates
	setRenderStates3DMode();

	// set fog mode
	setFog(FogColor, FogType, FogStart, FogEnd, FogDensity, PixelFog, RangeFog);

	// create matrix for flipping textures
	TextureFlipMatrix.buildTextureTransform(0.0f, core::vector2df(0, 0), core::vector2df(0, 1.0f), core::vector2df(1.0f, -1.0f));

	// We need to reset once more at the beginning of the first rendering.
	// This fixes problems with intermediate changes to the material during texture load.
	ResetRenderStates = true;

	return true;
}